

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

Operator *
getOperator(Operator *__return_storage_ptr__,QSpanData *data,QT_FT_Span *spans,int spanCount)

{
  Operator *pOVar1;
  
  memcpy(__return_storage_ptr__,&DAT_006dea50,0xb0);
  pOVar1 = (Operator *)
           (*(code *)(&DAT_006de4b0 +
                     *(int *)(&DAT_006de4b0 + (ulong)((*(ushort *)&data->field_0x88 & 0xff) - 1) * 4
                             )))();
  return pOVar1;
}

Assistant:

static inline Operator getOperator(const QSpanData *data, const QT_FT_Span *spans, int spanCount)
{
    Operator op;
    bool solidSource = false;
    switch(data->type) {
    case QSpanData::Solid:
        solidSource = data->solidColor.alphaF() >= 1.0f;
        op.noGradient = {};
        op.srcFetch = nullptr;
        op.srcFetch64 = nullptr;
        op.srcFetchFP = nullptr;
        break;
    case QSpanData::LinearGradient:
        solidSource = !data->gradient.alphaColor;
        getLinearGradientValues(&op.linear, data);
        op.srcFetch = qt_fetch_linear_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_linear_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_linear_gradient_rgbfp;
#endif
        break;
    case QSpanData::RadialGradient:
        solidSource = !data->gradient.alphaColor;
        getRadialGradientValues(&op.radial, data);
        op.srcFetch = qt_fetch_radial_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_radial_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_radial_gradient_rgbfp;
#endif
        break;
    case QSpanData::ConicalGradient:
        solidSource = !data->gradient.alphaColor;
        op.noGradient = {}; // sic!
        op.srcFetch = qt_fetch_conical_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_conical_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_conical_gradient_rgbfp;
#endif
        break;
    case QSpanData::Texture:
        solidSource = !data->texture.hasAlpha;
        op.noGradient = {};
        op.srcFetch = getSourceFetch(getBlendType(data), data->texture.format);
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = getSourceFetch64(getBlendType(data), data->texture.format);
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = getSourceFetchFP(getBlendType(data), data->texture.format);
#endif
        break;
    default:
        Q_UNREACHABLE();
        break;
    }
#if !QT_CONFIG(raster_64bit)
    op.srcFetch64 = nullptr;
#endif
#if !QT_CONFIG(raster_fp)
    op.srcFetchFP = nullptr;
#endif

    op.mode = data->rasterBuffer->compositionMode;
    if (op.mode == QPainter::CompositionMode_SourceOver && solidSource)
        op.mode = QPainter::CompositionMode_Source;

    op.destFetch = destFetchProc[data->rasterBuffer->format];
#if QT_CONFIG(raster_64bit)
    op.destFetch64 = destFetchProc64[data->rasterBuffer->format];
#else
    op.destFetch64 = nullptr;
#endif
#if QT_CONFIG(raster_fp)
    op.destFetchFP = destFetchProcFP[data->rasterBuffer->format];
#else
    op.destFetchFP = nullptr;
#endif
    if (op.mode == QPainter::CompositionMode_Source &&
            (data->type != QSpanData::Texture || data->texture.const_alpha == 256)) {
        const QT_FT_Span *lastSpan = spans + spanCount;
        bool alphaSpans = false;
        while (spans < lastSpan) {
            if (spans->coverage != 255) {
                alphaSpans = true;
                break;
            }
            ++spans;
        }
        if (!alphaSpans && spanCount > 0) {
            // If all spans are opaque we do not need to fetch dest.
            // But don't clear passthrough destFetch as they are just as fast and save destStore.
            if (op.destFetch != destFetchARGB32P)
                op.destFetch = destFetchUndefined;
#if QT_CONFIG(raster_64bit)
            if (op.destFetch64 != destFetchRGB64)
                op.destFetch64 = destFetch64Undefined;
#endif
#if QT_CONFIG(raster_fp)
            if (op.destFetchFP != destFetchRGBFP)
                op.destFetchFP = destFetchFPUndefined;
#endif
        }
    }

    op.destStore = destStoreProc[data->rasterBuffer->format];
    op.funcSolid = functionForModeSolid[op.mode];
    op.func = functionForMode[op.mode];
#if QT_CONFIG(raster_64bit)
    op.destStore64 = destStoreProc64[data->rasterBuffer->format];
    op.funcSolid64 = functionForModeSolid64[op.mode];
    op.func64 = functionForMode64[op.mode];
#else
    op.destStore64 = nullptr;
    op.funcSolid64 = nullptr;
    op.func64 = nullptr;
#endif
#if QT_CONFIG(raster_fp)
    op.destStoreFP = destStoreFP;
    op.funcSolidFP = functionForModeSolidFP[op.mode];
    op.funcFP = functionForModeFP[op.mode];
#else
    op.destStoreFP = nullptr;
    op.funcSolidFP = nullptr;
    op.funcFP = nullptr;
#endif

    return op;
}